

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

bool __thiscall llama_context::rm_adapter_lora(llama_context *this,llama_adapter_lora *adapter)

{
  bool bVar1;
  undefined8 in_RSI;
  unordered_map<llama_adapter_lora_*,_float,_std::hash<llama_adapter_lora_*>,_std::equal_to<llama_adapter_lora_*>,_std::allocator<std::pair<llama_adapter_lora_*const,_float>_>_>
  *in_RDI;
  iterator pos;
  unordered_map<llama_adapter_lora_*,_float,_std::hash<llama_adapter_lora_*>,_std::equal_to<llama_adapter_lora_*>,_std::allocator<std::pair<llama_adapter_lora_*const,_float>_>_>
  *in_stack_ffffffffffffffb8;
  _Node_iterator_base<std::pair<llama_adapter_lora_*const,_float>,_false> in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<llama_adapter_lora_*const,_float>,_false> local_28;
  _Node_iterator_base<std::pair<llama_adapter_lora_*const,_float>,_false> local_20 [4];
  
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: adapter = %p\n","rm_adapter_lora",in_RSI);
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<llama_adapter_lora_*,_float,_std::hash<llama_adapter_lora_*>,_std::equal_to<llama_adapter_lora_*>,_std::allocator<std::pair<llama_adapter_lora_*const,_float>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x3dc65d);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<llama_adapter_lora_*,_float,_std::hash<llama_adapter_lora_*>,_std::equal_to<llama_adapter_lora_*>,_std::allocator<std::pair<llama_adapter_lora_*const,_float>_>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::__detail::operator!=(local_20,&local_28);
  if (bVar1) {
    std::
    unordered_map<llama_adapter_lora_*,_float,_std::hash<llama_adapter_lora_*>,_std::equal_to<llama_adapter_lora_*>,_std::allocator<std::pair<llama_adapter_lora_*const,_float>_>_>
    ::erase(in_RDI,(iterator)in_stack_ffffffffffffffc8._M_cur);
  }
  return bVar1;
}

Assistant:

bool llama_context::rm_adapter_lora(
            llama_adapter_lora * adapter) {
    LLAMA_LOG_DEBUG("%s: adapter = %p\n", __func__, (void *) adapter);

    auto pos = loras.find(adapter);
    if (pos != loras.end()) {
        loras.erase(pos);
        return true;
    }

    return false;
}